

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O1

void __thiscall ImNodes::CanvasState::CanvasState(CanvasState *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  _CanvasStateImpl *__s;
  ImGuiStyle *pIVar4;
  
  this->zoom = 1.0;
  memset(&this->offset,0,0x88);
  (this->style).curve_thickness = 5.0;
  (this->style).connection_indent = 1.0;
  this->_impl = (_CanvasStateImpl *)0x0;
  __s = (_CanvasStateImpl *)operator_new(0xa8);
  memset(__s,0,0xa8);
  this->_impl = __s;
  pIVar4 = ImGui::GetStyle();
  fVar1 = pIVar4->Colors[0x1b].y;
  fVar2 = pIVar4->Colors[0x1b].z;
  fVar3 = pIVar4->Colors[0x1b].w;
  this->colors[0].Value.x = pIVar4->Colors[0x1b].x;
  this->colors[0].Value.y = fVar1;
  this->colors[0].Value.z = fVar2;
  this->colors[0].Value.w = fVar3;
  fVar1 = pIVar4->Colors[2].y;
  fVar2 = pIVar4->Colors[2].z;
  fVar3 = pIVar4->Colors[2].w;
  this->colors[1].Value.x = pIVar4->Colors[2].x;
  this->colors[1].Value.y = fVar1;
  this->colors[1].Value.z = fVar2;
  this->colors[1].Value.w = fVar3;
  fVar1 = pIVar4->Colors[9].y;
  fVar2 = pIVar4->Colors[9].z;
  fVar3 = pIVar4->Colors[9].w;
  this->colors[2].Value.x = pIVar4->Colors[9].x;
  this->colors[2].Value.y = fVar1;
  this->colors[2].Value.z = fVar2;
  this->colors[2].Value.w = fVar3;
  fVar1 = pIVar4->Colors[5].y;
  fVar2 = pIVar4->Colors[5].z;
  fVar3 = pIVar4->Colors[5].w;
  this->colors[3].Value.x = pIVar4->Colors[5].x;
  this->colors[3].Value.y = fVar1;
  this->colors[3].Value.z = fVar2;
  this->colors[3].Value.w = fVar3;
  fVar1 = pIVar4->Colors[0x26].y;
  fVar2 = pIVar4->Colors[0x26].z;
  fVar3 = pIVar4->Colors[0x26].w;
  this->colors[4].Value.x = pIVar4->Colors[0x26].x;
  this->colors[4].Value.y = fVar1;
  this->colors[4].Value.z = fVar2;
  this->colors[4].Value.w = fVar3;
  fVar1 = pIVar4->Colors[0x27].y;
  fVar2 = pIVar4->Colors[0x27].z;
  fVar3 = pIVar4->Colors[0x27].w;
  this->colors[5].Value.x = pIVar4->Colors[0x27].x;
  this->colors[5].Value.y = fVar1;
  this->colors[5].Value.z = fVar2;
  this->colors[5].Value.w = fVar3;
  fVar1 = pIVar4->Colors[9].y;
  fVar2 = pIVar4->Colors[9].z;
  fVar3 = pIVar4->Colors[9].w;
  this->colors[6].Value.x = pIVar4->Colors[9].x;
  this->colors[6].Value.y = fVar1;
  this->colors[6].Value.z = fVar2;
  this->colors[6].Value.w = fVar3;
  this->colors[6].Value.w = 0.25;
  fVar1 = pIVar4->Colors[5].y;
  fVar2 = pIVar4->Colors[5].z;
  fVar3 = pIVar4->Colors[5].w;
  this->colors[7].Value.x = pIVar4->Colors[5].x;
  this->colors[7].Value.y = fVar1;
  this->colors[7].Value.z = fVar2;
  this->colors[7].Value.w = fVar3;
  return;
}

Assistant:

CanvasState::CanvasState() noexcept
{
    _impl = new _CanvasStateImpl();

    auto& imgui_style = ImGui::GetStyle();
    colors[ColCanvasLines] = imgui_style.Colors[ImGuiCol_Separator];
    colors[ColNodeBg] = imgui_style.Colors[ImGuiCol_WindowBg];
    colors[ColNodeActiveBg] = imgui_style.Colors[ImGuiCol_FrameBgActive];
    colors[ColNodeBorder] = imgui_style.Colors[ImGuiCol_Border];
    colors[ColConnection] = imgui_style.Colors[ImGuiCol_PlotLines];
    colors[ColConnectionActive] = imgui_style.Colors[ImGuiCol_PlotLinesHovered];
    colors[ColSelectBg] = imgui_style.Colors[ImGuiCol_FrameBgActive];
    colors[ColSelectBg].Value.w = 0.25f;
    colors[ColSelectBorder] = imgui_style.Colors[ImGuiCol_Border];
}